

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O1

CURLcode curl_easy_perform(Curl_easy *data)

{
  int iVar1;
  CURLMcode CVar2;
  Curl_multi *multi;
  long lVar3;
  CURLMsg *pCVar4;
  uint uVar5;
  CURLcode CVar6;
  int timeout_ms;
  ulong uVar7;
  timeval older;
  timeval newer;
  int still_running;
  sigpipe_ignore pipe_st;
  int local_f8;
  int local_f4;
  ulong local_f0;
  ulong local_e8;
  Curl_easy *local_e0;
  ulong local_d8;
  sigpipe_ignore local_d0;
  
  if (data == (Curl_easy *)0x0) {
    CVar6 = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else if (data->multi == (Curl_multi *)0x0) {
    multi = data->multi_easy;
    if (multi == (Curl_multi *)0x0) {
      multi = Curl_multi_handle(1,3);
      if (multi == (Curl_multi *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      data->multi_easy = multi;
    }
    curl_multi_setopt(multi,CURLMOPT_MAXCONNECTS,(data->set).maxconnects);
    CVar2 = curl_multi_add_handle(multi,data);
    if (CVar2 == CURLM_OK) {
      local_f0 = 0;
      sigpipe_ignore(data,&local_d0);
      data->multi = multi;
      uVar7 = 0;
      local_e8 = 0;
      local_e0 = data;
      do {
        local_f8 = 0;
        older = curlx_tvnow();
        CVar2 = curl_multi_wait(multi,(curl_waitfd *)0x0,0,1000,&local_f4);
        if (CVar2 == CURLM_OK) {
          uVar5 = 0;
          local_d8 = uVar7;
          if (local_f4 == 0) {
            newer = curlx_tvnow();
            lVar3 = curlx_tvdiff(newer,older);
            uVar5 = 0;
            if (lVar3 < 0xb) {
              iVar1 = (int)local_e8;
              uVar5 = iVar1 + 1;
              if (1 < iVar1) {
                timeout_ms = 1 << ((byte)local_e8 & 0x1f);
                if (8 < iVar1) {
                  timeout_ms = 1000;
                }
                Curl_wait_ms(timeout_ms);
              }
            }
          }
          CVar2 = curl_multi_perform(multi,&local_f8);
          local_e8 = (ulong)uVar5;
          uVar7 = local_d8;
        }
        if ((local_f8 == 0 && CVar2 == CURLM_OK) &&
           (pCVar4 = curl_multi_info_read(multi,&local_f4), pCVar4 != (CURLMsg *)0x0)) {
          local_f0 = (ulong)(pCVar4->data).result;
          uVar7 = CONCAT71((int7)(uVar7 >> 8),1);
        }
      } while ((CVar2 == CURLM_OK) && ((uVar7 & 1) == 0));
      CVar6 = (CURLcode)local_f0;
      if (CVar2 != CURLM_OK) {
        CVar6 = (uint)(CVar2 != CURLM_OUT_OF_MEMORY) * 0x10 + CURLE_OUT_OF_MEMORY;
      }
      curl_multi_remove_handle(multi,local_e0);
      if (local_d0.no_signal == false) {
        sigaction(0xd,(sigaction *)&local_d0,(sigaction *)0x0);
      }
    }
    else {
      curl_multi_cleanup(multi);
      CVar6 = CURLE_FAILED_INIT;
      if (CVar2 == CURLM_OUT_OF_MEMORY) {
        CVar6 = CURLE_OUT_OF_MEMORY;
      }
    }
  }
  else {
    Curl_failf(data,"easy handle already used in multi handle");
    CVar6 = CURLE_FAILED_INIT;
  }
  return CVar6;
}

Assistant:

static CURLcode easy_perform(struct Curl_easy *data, bool events)
{
  struct Curl_multi *multi;
  CURLMcode mcode;
  CURLcode result = CURLE_OK;
  SIGPIPE_VARIABLE(pipe_st);

  if(!data)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(data->multi) {
    failf(data, "easy handle already used in multi handle");
    return CURLE_FAILED_INIT;
  }

  if(data->multi_easy)
    multi = data->multi_easy;
  else {
    /* this multi handle will only ever have a single easy handled attached
       to it, so make it use minimal hashes */
    multi = Curl_multi_handle(1, 3);
    if(!multi)
      return CURLE_OUT_OF_MEMORY;
    data->multi_easy = multi;
  }

  /* Copy the MAXCONNECTS option to the multi handle */
  curl_multi_setopt(multi, CURLMOPT_MAXCONNECTS, data->set.maxconnects);

  mcode = curl_multi_add_handle(multi, data);
  if(mcode) {
    curl_multi_cleanup(multi);
    if(mcode == CURLM_OUT_OF_MEMORY)
      return CURLE_OUT_OF_MEMORY;
    else
      return CURLE_FAILED_INIT;
  }

  sigpipe_ignore(data, &pipe_st);

  /* assign this after curl_multi_add_handle() since that function checks for
     it and rejects this handle otherwise */
  data->multi = multi;

  /* run the transfer */
  result = events ? easy_events(multi) : easy_transfer(multi);

  /* ignoring the return code isn't nice, but atm we can't really handle
     a failure here, room for future improvement! */
  (void)curl_multi_remove_handle(multi, data);

  sigpipe_restore(&pipe_st);

  /* The multi handle is kept alive, owned by the easy handle */
  return result;
}